

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

bool sb_update_header(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  __int_type _Var2;
  bool bVar3;
  
  psVar1 = handle->file->sb;
  _Var2 = (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
  if (((psVar1 == (superblock *)0x0) ||
      ((psVar1->last_hdr_bid).super___atomic_base<unsigned_long>._M_i == _Var2)) ||
     ((handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i <=
      (psVar1->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i)) {
    bVar3 = false;
  }
  else {
    LOCK();
    (psVar1->last_hdr_bid).super___atomic_base<unsigned_long>._M_i = _Var2;
    UNLOCK();
    LOCK();
    (psVar1->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i =
         (handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
    UNLOCK();
    bVar3 = true;
    if (((handle->file->last_writable_bmp_revnum).super___atomic_base<unsigned_long>._M_i ==
         (psVar1->bmp_revnum).super___atomic_base<unsigned_long>._M_i) &&
       (psVar1->bmp_prev != (uint8_t *)0x0)) {
      free(psVar1->bmp_prev);
      psVar1->bmp_prev = (uint8_t *)0x0;
    }
  }
  return bVar3;
}

Assistant:

bool sb_update_header(fdb_kvs_handle *handle)
{
    bool ret = false;
    struct superblock *sb = handle->file->sb;

    bid_t last_hdr_bid = atomic_get_uint64_t(&handle->last_hdr_bid);
    if (sb && atomic_get_uint64_t(&sb->last_hdr_bid) != last_hdr_bid &&
        atomic_get_uint64_t(&sb->last_hdr_revnum) < handle->cur_header_revnum) {

        atomic_store_uint64_t(&sb->last_hdr_bid, last_hdr_bid);
        atomic_store_uint64_t(&sb->last_hdr_revnum, handle->cur_header_revnum);

        uint64_t lw_revnum = atomic_get_uint64_t(&handle->file->last_writable_bmp_revnum);
        if (lw_revnum == atomic_get_uint64_t(&sb->bmp_revnum) &&
            sb->bmp_prev) {
            free(sb->bmp_prev);
            sb->bmp_prev = NULL;
        }
        ret = true;
    }

    return ret;
}